

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape_string.cpp
# Opt level: O3

string * __thiscall
libtorrent::(anonymous_namespace)::escape_string_impl_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *str,int len,int offset)

{
  _anonymous_namespace_ _Var1;
  char *pcVar2;
  string *psVar3;
  char cVar4;
  long lVar5;
  
  psVar3 = (string *)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar3;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < (int)str) {
    lVar5 = 0;
    do {
      _Var1 = this[lVar5];
      pcVar2 = strchr("%+;?:@=&,$/-_!.~*()ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789"
                      + (uint)len,(int)(char)_Var1);
      cVar4 = (char)__return_storage_ptr__;
      if ((_Var1 == (_anonymous_namespace_)0x0) || (pcVar2 == (char *)0x0)) {
        std::__cxx11::string::push_back(cVar4);
        std::__cxx11::string::push_back(cVar4);
      }
      psVar3 = (string *)std::__cxx11::string::push_back(cVar4);
      lVar5 = lVar5 + 1;
    } while ((int)str != (int)lVar5);
  }
  return psVar3;
}

Assistant:

std::string read_until(char const*& str, char const delim, char const* end)
	{
		TORRENT_ASSERT(str <= end);

		std::string ret;
		while (str != end && *str != delim)
		{
			ret += *str;
			++str;
		}
		// skip the delimiter as well
		while (str != end && *str == delim) ++str;
		return ret;
	}